

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

Image * Bitmap_Operation::Load(string *path)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  uchar *puVar10;
  pointer pBVar11;
  byte *pbVar12;
  _Ios_Openmode in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint8_t *palleteValue;
  uint8_t *outX;
  uint8_t *inXEnd;
  uint8_t *inX;
  uint8_t *outY;
  uint8_t *inYEnd;
  uint8_t *inY;
  size_t readSize_1;
  size_t blockSize;
  size_t dataReaded;
  size_t dataToRead;
  vector<unsigned_char,_std::allocator<unsigned_char>_> generatedPallete;
  size_t readSize;
  size_t blockSize_1;
  size_t dataReaded_1;
  size_t dataToRead_1;
  bool convertFrom256Color;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pallete;
  uint32_t palleteSize;
  uint32_t rowSize;
  unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
  info;
  uint32_t dibHeaderSize;
  size_t dibHeaderOffset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  BitmapFileHeader header;
  streamoff length;
  fstream file;
  Image *image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  undefined2 in_stack_fffffffffffffb34;
  uint8_t in_stack_fffffffffffffb36;
  uint8_t in_stack_fffffffffffffb37;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  uint32_t in_stack_fffffffffffffb44;
  size_type in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  imageException *in_stack_fffffffffffffb60;
  ulong local_478;
  undefined2 in_stack_fffffffffffffba4;
  undefined1 in_stack_fffffffffffffba6;
  char in_stack_fffffffffffffba7;
  ulong local_458;
  bool local_3ed;
  bool local_3d9;
  uchar *local_378;
  byte *local_368;
  uchar *local_360;
  byte *local_350;
  long local_338;
  ulong local_330;
  long local_2f8;
  ulong local_2f0;
  bool local_2e2;
  uint local_2c4;
  BitmapFileHeader local_2a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_290;
  BitmapFileHeader local_274;
  fpos local_260 [16];
  undefined1 local_250 [16];
  ulong local_240;
  undefined4 local_234;
  long local_230 [68];
  _Ios_Openmode local_10;
  
  local_10 = in_ESI;
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    uVar8 = __cxa_allocate_exception(0x28);
    imageException::imageException
              (in_stack_fffffffffffffb60,
               (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    __cxa_throw(uVar8,&imageException::typeinfo,imageException::~imageException);
  }
  std::fstream::fstream(local_230);
  std::operator|(_S_in,_S_bin);
  std::fstream::open((string *)local_230,local_10);
  bVar1 = std::ios::operator!((ios *)((long)local_230 + *(long *)(local_230[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istream::seekg((long)local_230,_S_beg);
    local_250 = std::istream::tellg();
    uVar7 = std::fpos::operator_cast_to_long((fpos *)local_250);
    local_240 = uVar7;
    std::fpos<__mbstate_t>::fpos
              ((fpos<__mbstate_t> *)
               CONCAT17(in_stack_fffffffffffffb37,
                        CONCAT16(in_stack_fffffffffffffb36,
                                 CONCAT24(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30))),
               (streamoff)in_stack_fffffffffffffb28);
    uVar9 = std::fpos::operator_cast_to_long(local_260);
    local_3d9 = uVar7 == uVar9 || local_240 < 0x4c;
    if (local_3d9) {
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                ((ImageTemplate<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (uint32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffb38,in_stack_fffffffffffffb37,
                 in_stack_fffffffffffffb36);
      local_234 = 1;
    }
    else {
      std::istream::seekg((long)local_230,_S_beg);
      BitmapFileHeader::BitmapFileHeader(&local_274);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12e847);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 in_stack_fffffffffffffb48,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12e870);
      puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12e87d);
      std::istream::read((char *)local_230,(long)puVar10);
      BitmapFileHeader::set
                ((BitmapFileHeader *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 in_stack_fffffffffffffb38);
      BitmapFileHeader::BitmapFileHeader(&local_2a8);
      local_3ed = local_274.bfType == local_2a8.bfType &&
                  (long)(ulong)local_274.bfOffBits < (long)local_240;
      if (local_3ed) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb48);
        puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12e9a3);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_290);
        std::istream::read((char *)local_230,(long)puVar10);
        get_value<unsigned_int>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffb37,
                            CONCAT16(in_stack_fffffffffffffb36,
                                     CONCAT24(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30)))
                   ,(size_t *)in_stack_fffffffffffffb28,(uint *)0x12ea06);
        getInfoHeader((uint32_t)(in_stack_fffffffffffffb48 >> 0x20));
        std::
        unique_ptr<Bitmap_Operation::BitmapDibHeader,std::default_delete<Bitmap_Operation::BitmapDibHeader>>
        ::unique_ptr<std::default_delete<Bitmap_Operation::BitmapDibHeader>,void>
                  ((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                    *)CONCAT17(in_stack_fffffffffffffb37,
                               CONCAT16(in_stack_fffffffffffffb36,
                                        CONCAT24(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30
                                                ))),(pointer)in_stack_fffffffffffffb28);
        pBVar11 = std::
                  unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                  ::get((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                         *)CONCAT17(in_stack_fffffffffffffb37,
                                    CONCAT16(in_stack_fffffffffffffb36,
                                             CONCAT24(in_stack_fffffffffffffb34,
                                                      in_stack_fffffffffffffb30))));
        if (pBVar11 == (pointer)0x0) {
          PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                    ((ImageTemplate<unsigned_char> *)
                     CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (uint32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                     (uint32_t)in_stack_fffffffffffffb38,in_stack_fffffffffffffb37,
                     in_stack_fffffffffffffb36);
          local_234 = 1;
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                     in_stack_fffffffffffffb48);
          puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12eab8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_290);
          std::istream::read((char *)local_230,(long)(puVar10 + 4));
          pBVar11 = std::
                    unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                    ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                  *)0x12eafc);
          (*pBVar11->_vptr_BitmapDibHeader[2])(pBVar11,&local_290);
          pBVar11 = std::
                    unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                    ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                  *)0x12eb1f);
          uVar2 = (*pBVar11->_vptr_BitmapDibHeader[0xc])(pBVar11,&local_274);
          if ((uVar2 & 1) == 0) {
            pBVar11 = std::
                      unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                      ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                    *)0x12eb82);
            iVar3 = (*pBVar11->_vptr_BitmapDibHeader[4])();
            pBVar11 = std::
                      unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                      ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                    *)0x12eba4);
            uVar2 = (*pBVar11->_vptr_BitmapDibHeader[6])();
            uVar7 = local_240;
            uVar5 = local_274.bfOffBits;
            local_2c4 = iVar3 * (uVar2 & 0xff);
            if ((local_2c4 & 3) != 0) {
              local_2c4 = ((local_2c4 >> 2) + 1) * 4;
            }
            pBVar11 = std::
                      unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                      ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                    *)0x12ec33);
            iVar3 = (*pBVar11->_vptr_BitmapDibHeader[5])();
            if (uVar7 == uVar5 + local_2c4 * iVar3) {
              pBVar11 = std::
                        unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                        ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                      *)0x12ecb8);
              iVar3 = (*pBVar11->_vptr_BitmapDibHeader[7])();
              uVar2 = (local_274.bfOffBits - iVar3) - local_274.overallSize;
              std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12ed11);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                         in_stack_fffffffffffffb48,
                         (allocator_type *)
                         CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
              std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12ed3d);
              local_2e2 = false;
              if (uVar2 != 0) {
                local_2f8 = 0;
                for (local_2f0 = (ulong)uVar2; local_2f0 != 0; local_2f0 = local_2f0 - local_458) {
                  if (local_2f0 < 0x400001) {
                    local_458 = local_2f0;
                  }
                  else {
                    local_458 = 0x400000;
                  }
                  puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       0x12edd3);
                  std::istream::read((char *)local_230,(long)(puVar10 + local_2f8));
                  local_2f8 = local_458 + local_2f8;
                }
                if (uVar2 == 0x400) {
                  pBVar11 = std::
                            unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                            ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                          *)0x12ee8d);
                  iVar3 = (*pBVar11->_vptr_BitmapDibHeader[6])();
                  in_stack_fffffffffffffba7 = (char)iVar3;
                  if (in_stack_fffffffffffffba7 == '\x01') {
                    generateGrayScalePallete();
                    local_2e2 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 *)CONCAT17(in_stack_fffffffffffffb37,
                                                            CONCAT16(in_stack_fffffffffffffb36,
                                                                     CONCAT24(
                                                  in_stack_fffffffffffffb34,
                                                  in_stack_fffffffffffffb30))),
                                                in_stack_fffffffffffffb28);
                    in_stack_fffffffffffffba6 = local_2e2;
                    if (local_2e2) {
                      pBVar11 = std::
                                unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                              *)0x12eef8);
                      (*pBVar11->_vptr_BitmapDibHeader[10])(pBVar11,3);
                    }
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
                  }
                }
              }
              pBVar11 = std::
                        unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                        ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                      *)0x12ef57);
              iVar3 = (*pBVar11->_vptr_BitmapDibHeader[4])();
              pBVar11 = std::
                        unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                        ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                      *)0x12ef76);
              (*pBVar11->_vptr_BitmapDibHeader[5])();
              pBVar11 = std::
                        unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                        ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                      *)0x12ef95);
              (*pBVar11->_vptr_BitmapDibHeader[6])();
              PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                        ((ImageTemplate<unsigned_char> *)
                         CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         (uint32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                         (uint32_t)in_stack_fffffffffffffb38,in_stack_fffffffffffffb37,
                         in_stack_fffffffffffffb36);
              pBVar11 = std::
                        unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                        ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                      *)0x12efe3);
              iVar4 = (*pBVar11->_vptr_BitmapDibHeader[5])();
              local_338 = 0;
              for (local_330 = (ulong)(local_2c4 * iVar4); local_330 != 0;
                  local_330 = local_330 - local_478) {
                if (local_330 < 0x400001) {
                  local_478 = local_330;
                }
                else {
                  local_478 = 0x400000;
                }
                puVar10 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
                std::istream::read((char *)local_230,(long)(puVar10 + local_338));
                local_338 = local_478 + local_338;
              }
              if (local_2e2 != false) {
                puVar10 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
                pBVar11 = std::
                          unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                          ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                        *)0x12f138);
                iVar4 = (*pBVar11->_vptr_BitmapDibHeader[5])();
                local_350 = puVar10 + local_2c4 * (iVar4 + -1);
                pbVar12 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
                local_360 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
                uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
                uVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
                local_360 = local_360 + uVar5 * (uVar6 - 1);
                while (local_350 != pbVar12) {
                  local_368 = local_350;
                  pBVar11 = std::
                            unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                            ::operator->((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                                          *)0x12f212);
                  iVar4 = (*pBVar11->_vptr_BitmapDibHeader[4])();
                  local_368 = local_368 + (iVar4 - 1);
                  local_378 = local_360;
                  in_stack_fffffffffffffb44 =
                       PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI);
                  local_378 = local_378 + (in_stack_fffffffffffffb44 - 1) * 3;
                  while( true ) {
                    puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         0x12f293);
                    puVar10 = puVar10 + (ulong)*local_368 * 4;
                    *local_378 = *puVar10;
                    local_378[1] = puVar10[1];
                    local_378[2] = puVar10[2];
                    if (local_368 == local_350) break;
                    local_368 = local_368 + -1;
                    local_378 = local_378 + -3;
                  }
                  local_350 = local_350 + -(ulong)local_2c4;
                  uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
                  in_stack_fffffffffffffb34 = (undefined2)uVar5;
                  in_stack_fffffffffffffb36 = (uint8_t)(uVar5 >> 0x10);
                  in_stack_fffffffffffffb37 = (uint8_t)(uVar5 >> 0x18);
                  local_360 = local_360 + -(ulong)uVar5;
                }
              }
              flipData((Image *)CONCAT17(in_stack_fffffffffffffba7,
                                         CONCAT16(in_stack_fffffffffffffba6,
                                                  CONCAT24(in_stack_fffffffffffffba4,iVar3))));
              local_234 = 1;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
            }
            else {
              PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                        ((ImageTemplate<unsigned_char> *)
                         CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         (uint32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                         (uint32_t)in_stack_fffffffffffffb38,in_stack_fffffffffffffb37,
                         in_stack_fffffffffffffb36);
              local_234 = 1;
            }
          }
          else {
            PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                      ((ImageTemplate<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       (uint32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                       (uint32_t)in_stack_fffffffffffffb38,in_stack_fffffffffffffb37,
                       in_stack_fffffffffffffb36);
            local_234 = 1;
          }
        }
        std::
        unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
        ::~unique_ptr((unique_ptr<Bitmap_Operation::BitmapDibHeader,_std::default_delete<Bitmap_Operation::BitmapDibHeader>_>
                       *)CONCAT17(in_stack_fffffffffffffb37,
                                  CONCAT16(in_stack_fffffffffffffb36,
                                           CONCAT24(in_stack_fffffffffffffb34,
                                                    in_stack_fffffffffffffb30))));
      }
      else {
        PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                  ((ImageTemplate<unsigned_char> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   (uint32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                   (uint32_t)in_stack_fffffffffffffb38,in_stack_fffffffffffffb37,
                   in_stack_fffffffffffffb36);
        local_234 = 1;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    }
  }
  else {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               (uint32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20),
               (uint32_t)in_stack_fffffffffffffb38,in_stack_fffffffffffffb37,
               in_stack_fffffffffffffb36);
    local_234 = 1;
  }
  std::fstream::~fstream(local_230);
  return in_RDI;
}

Assistant:

PenguinV_Image::Image Load( const std::string & path )
    {
        if( path.empty() )
            throw imageException( "Incorrect parameters for bitmap loading" );

        std::fstream file;
        file.open( path, std::fstream::in | std::fstream::binary );

        if( !file )
            return PenguinV_Image::Image();

        file.seekg( 0, file.end );
        std::streamoff length = file.tellg();

        if( length == std::char_traits<char>::pos_type( -1 ) ||
            static_cast<size_t>(length) < sizeof( BitmapFileHeader ) + sizeof( BitmapInfoHeader ) )
            return PenguinV_Image::Image();

        file.seekg( 0, file.beg );

        // read bitmap header
        BitmapFileHeader header;

        std::vector < uint8_t > data( sizeof( BitmapFileHeader ) );

        file.read( reinterpret_cast<char *>(data.data()), header.overallSize );

        header.set( data );

        // we suppose to compare header.bfSize and length but some editors don't put correct information
        if( header.bfType != BitmapFileHeader().bfType || header.bfOffBits >= length )
            return PenguinV_Image::Image();

        // read the size of dib header
        data.resize( 4u );

        file.read( reinterpret_cast<char *>(data.data()), static_cast<std::streamsize>(data.size()) );

        size_t dibHeaderOffset = 0;
        uint32_t dibHeaderSize = 0;

        get_value( data, dibHeaderOffset, dibHeaderSize );

        // create proper dib header
        std::unique_ptr <BitmapDibHeader> info( getInfoHeader( dibHeaderSize ) );

        if( info.get() == nullptr )
            return PenguinV_Image::Image();

        data.resize( dibHeaderSize );

        // read bitmap info
        file.read( reinterpret_cast<char *>(data.data() + sizeof( dibHeaderSize )), static_cast<std::streamsize>(data.size() - sizeof( dibHeaderSize )) );

        info->set( data );

        if( info->validate( header ) )
            return PenguinV_Image::Image();

        uint32_t rowSize = info->width() * info->colorCount();
        if( rowSize % BITMAP_ALIGNMENT != 0 )
            rowSize = (rowSize / BITMAP_ALIGNMENT + 1) * BITMAP_ALIGNMENT;

        if( length != header.bfOffBits + rowSize * info->height() )
            return PenguinV_Image::Image();

        const uint32_t palleteSize = header.bfOffBits - info->size() - header.overallSize;
        std::vector < uint8_t > pallete( palleteSize );

        bool convertFrom256Color = false; // 256 color image case

        if( palleteSize > 0 ) {
            size_t dataToRead = palleteSize;
            size_t dataReaded = 0;

            const size_t blockSize = 4 * 1024 * 1024; // read by 4 MB blocks

            while( dataToRead > 0 ) {
                size_t readSize = dataToRead > blockSize ? blockSize : dataToRead;

                file.read( reinterpret_cast<char *>(pallete.data() + dataReaded), static_cast<std::streamsize>(readSize) );

                dataReaded += readSize;
                dataToRead -= readSize;
            }

            if( (palleteSize == 1024u) && (info->colorCount() == 1u) ) {
                std::vector< uint8_t > generatedPallete = generateGrayScalePallete();

                if( pallete != generatedPallete ) {
                    convertFrom256Color = true;
                    info->setColorCount( 3u );
                }
            }
        }

        PenguinV_Image::Image image( info->width(), info->height(), info->colorCount(), BITMAP_ALIGNMENT );

        size_t dataToRead = rowSize * info->height();
        size_t dataReaded = 0;

        const size_t blockSize = 4 * 1024 * 1024; // read by 4 MB blocks

        while( dataToRead > 0 ) {
            size_t readSize = dataToRead > blockSize ? blockSize : dataToRead;

            file.read( reinterpret_cast<char *>(image.data() + dataReaded), static_cast<std::streamsize>(readSize) );

            dataReaded += readSize;
            dataToRead -= readSize;
        }

        // A special case for 256 color bitmap files
        if( convertFrom256Color ) {
            const uint8_t * inY    = image.data() + rowSize * (info->height() - 1);
            const uint8_t * inYEnd = image.data();
            uint8_t * outY  = image.data() + image.rowSize() * (image.height() - 1);

            for( ; inY != inYEnd; inY -= rowSize, outY -= image.rowSize() ) {
                const uint8_t * inX    = inY + (info->width() - 1u);
                const uint8_t * inXEnd = inY;
                uint8_t * outX = outY + 3u * (image.width() - 1u);

                for( ; ; --inX, outX -= 3u ) {
                    const uint8_t * palleteValue = pallete.data() + (*inX) * 4u;
                    *(outX    ) = *(palleteValue++);
                    *(outX + 1) = *(palleteValue++);
                    *(outX + 2) = *(palleteValue++);

                    if( inX == inXEnd ) // this is done to count first pixel in row
                        break;
                }
            }
        }

        // thanks to bitmap creators image is stored in wrong flipped format so we have to flip back
        flipData( image );

        return image;
    }